

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

bool is_name(char *str,char *namelist)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  char *string;
  char *list;
  char part [4608];
  char name [4608];
  char *in_stack_ffffffffffffdbe0;
  char local_2418 [4608];
  char local_1218 [4608];
  char *local_18;
  char *local_10;
  bool local_1;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    local_1 = false;
  }
  else if ((in_RDI == (char *)0x0) || (local_18 = in_RSI, local_10 = in_RDI, *in_RDI == '\0')) {
    local_1 = false;
  }
  else {
    while (local_10 = one_argument(in_stack_ffffffffffffdbe0,in_RDI),
          in_stack_ffffffffffffdbe0 = local_18, local_2418[0] != '\0') {
      do {
        in_stack_ffffffffffffdbe0 = one_argument(in_stack_ffffffffffffdbe0,in_RDI);
        if (local_1218[0] == '\0') {
          return false;
        }
        bVar1 = str_cmp(in_RDI,local_1218);
        if (!bVar1) {
          return true;
        }
        bVar1 = str_cmp(local_2418,local_1218);
      } while (bVar1);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool is_name(const char *str, const char *namelist)
{
	char name[MAX_INPUT_LENGTH], part[MAX_INPUT_LENGTH];
	char *list, *string;

	/* fix crash on nullptr namelist */
	if (namelist == nullptr || namelist[0] == '\0')
		return false;

	/* fixed to prevent is_name on "" returning true */
	if (str == nullptr || str[0] == '\0')
		return false;

	string = (char *)str;
	/* we need ALL parts of string to match part of namelist */
	for (;;) /* start parsing string */
	{
		str = one_argument((char *)str, part);

		if (part[0] == '\0')
			return true;

		/* check to see if this is part of namelist */
		list = (char *)namelist;
		for (;;) /* start parsing namelist */
		{
			list = one_argument(list, name);

			if (name[0] == '\0') /* this name was not found */
				return false;

			if (!str_cmp(string, name))
				return true; /* full pattern match */

			if (!str_cmp(part, name))
				break;
		}
	}
}